

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O0

CustomType<int> * __thiscall
FlatMap<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>,_std::less<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::operator[](FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *key)

{
  bool bVar1;
  pointer ppVar2;
  less<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  piecewise_construct_t *in_RDI;
  __normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
  pos;
  CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  less<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffffa7;
  const_iterator in_stack_ffffffffffffffa8;
  __normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
  local_48;
  pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
  *local_40;
  piecewise_construct_t local_31;
  pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
  *local_30;
  pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
  *local_28;
  __normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
  local_20;
  less<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  CustomType<int> *local_8;
  
  local_18 = in_RSI;
  local_28 = (pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
              *)std::
                vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>
                ::begin((vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>
                         *)in_stack_ffffffffffffff88);
  local_30 = (pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
              *)std::
                vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>
                ::end((vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>
                       *)in_stack_ffffffffffffff88);
  local_31 = in_RDI[0x19];
  local_20 = std::
             lower_bound<__gnu_cxx::__normal_iterator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>*,std::vector<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>,std::allocator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>>>>,CustomType<std::__cxx11::string>,FlatMap<CustomType<std::__cxx11::string>,CustomType<int>,std::less<CustomType<std::__cxx11::string>>>::ValueToKeyComparator>
                       (local_28,local_30,local_18);
  local_40 = (pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
              *)std::
                vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>
                ::end((vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>
                       *)in_stack_ffffffffffffff88);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
                      *)in_stack_ffffffffffffff90,
                     (__normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
                      *)in_stack_ffffffffffffff88);
  uVar3 = true;
  if (!bVar1) {
    in_stack_ffffffffffffff88 =
         (CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(in_RDI + 0x18);
    __gnu_cxx::
    __normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
    ::operator->(&local_20);
    uVar3 = std::
            less<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator()(local_18,in_stack_ffffffffffffff88,
                         (CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x24cb96);
    in_stack_ffffffffffffff90 = local_18;
  }
  if ((bool)uVar3 == false) {
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
             ::operator->(&local_20);
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>const*,std::vector<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>,std::allocator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>>>>
    ::__normal_iterator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>*>
              ((__normal_iterator<const_std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
                *)in_stack_ffffffffffffff90,
               (__normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
                *)in_stack_ffffffffffffff88);
    std::forward_as_tuple<CustomType<std::__cxx11::string>>(in_stack_ffffffffffffff88);
    local_48._M_current =
         (pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>
          *)std::
            vector<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>,std::allocator<std::pair<CustomType<std::__cxx11::string>,CustomType<int>>>>
            ::
            emplace<std::piecewise_construct_t_const&,std::tuple<CustomType<std::__cxx11::string>&&>,std::tuple<>>
                      ((vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffa7,
                                   CONCAT16(uVar3,in_stack_ffffffffffffffa0)),
                       in_stack_ffffffffffffffa8,in_RDI,
                       (tuple<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&&>
                        *)in_stack_ffffffffffffff90,(tuple<> *)in_stack_ffffffffffffff88);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_*,_std::vector<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>,_std::allocator<std::pair<CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_CustomType<int>_>_>_>_>
             ::operator->(&local_48);
  }
  local_8 = &ppVar2->second;
  return local_8;
}

Assistant:

T& operator[](Key&& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.emplace(pos, std::piecewise_construct, std::forward_as_tuple(std::move(key)), std::tuple<>())->second;
        } else {
            return pos->second;
        }
    }